

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::OverwriteRegisterWithValue
          (CodeGenGenericContext *this,x86XmmReg reg,x86Argument arg)

{
  x86Argument xVar1;
  x86Argument *pxVar2;
  x86XmmReg reg_local;
  CodeGenGenericContext *this_local;
  
  xVar1 = arg;
  KillRegister(this,reg);
  InvalidateDependand(this,reg);
  pxVar2 = this->xmmReg + reg;
  pxVar2->type = arg.type;
  *(undefined4 *)&pxVar2->field_0x4 = arg._4_4_;
  arg.field_1 = xVar1.field_1;
  pxVar2->field_1 = arg.field_1;
  arg._16_8_ = xVar1._16_8_;
  pxVar2->ptrBase = arg.ptrBase;
  pxVar2->ptrIndex = arg.ptrIndex;
  arg._24_8_ = xVar1._24_8_;
  pxVar2->ptrMult = arg.ptrMult;
  pxVar2->ptrNum = arg.ptrNum;
  this->xmmRegUpdate[reg] = (uint)(((long)this->x86Op - (long)this->x86Base) / 0x50);
  this->xmmRegRead[reg] = false;
  return;
}

Assistant:

void CodeGenGenericContext::OverwriteRegisterWithValue(x86XmmReg reg, x86Argument arg)
{
	// Destination is updated
	KillRegister(reg);
	InvalidateDependand(reg);

	xmmReg[reg] = arg;
	xmmRegUpdate[reg] = unsigned(x86Op - x86Base);
	xmmRegRead[reg] = false;
}